

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

Am_Value compute_click_start_when_proc(Am_Object *self)

{
  long lVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *initial;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Key in_SI;
  Am_Value AVar4;
  Am_Input_Char local_54;
  Am_Value_List char_list;
  Am_Object widget;
  Am_Value local_38;
  
  Am_Object::Get_Object(&widget,in_SI,10);
  bVar2 = Am_Object::Valid(&widget);
  if (bVar2) {
    get_owner_start_and_convert_string((Am_Object *)&char_list);
    Am_Input_Char::Am_Input_Char(&local_54,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    Am_Value_List::Start(&char_list);
    while( true ) {
      bVar2 = Am_Value_List::Last(&char_list);
      if (bVar2) break;
      pAVar3 = Am_Value_List::Get(&char_list);
      lVar1 = (pAVar3->value).long_value;
      if ((lVar1 != 0) && (pAVar3->type != Am_Input_Char::Am_Input_Char_ID)) {
        Am_Error();
      }
      local_54.code = (short)lVar1;
      local_54._2_2_ = ((ushort)((ulong)lVar1 >> 0x10) & 0xf0f) + (local_54._2_2_ & 0xf000) + 0x40;
      Am_Input_Char::operator_cast_to_Am_Value(&local_54);
      Am_Value_List::Set(&char_list,&local_38,true);
      Am_Value::~Am_Value(&local_38);
      Am_Value_List::Next(&char_list);
    }
    initial = Am_Value_List::operator_cast_to_Am_Wrapper_(&char_list);
    Am_Value::Am_Value((Am_Value *)self,initial);
    Am_Value_List::~Am_Value_List(&char_list);
  }
  else {
    Am_Input_Char::Am_Input_Char((Am_Input_Char *)&char_list,"LEFT_CLICK",true);
    Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&char_list);
  }
  Am_Object::~Am_Object(&widget);
  AVar4.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

Am_Define_Formula(Am_Value, compute_click_start_when)
{
  Am_Object widget = self.Get_Owner();
  if (widget.Valid()) {
    Am_Value_List char_list = get_owner_start_and_convert_string(widget);
    Am_Input_Char parent_char;
    for (char_list.Start(); !char_list.Last(); char_list.Next()) {
      parent_char = (Am_Input_Char)char_list.Get();
      parent_char.button_down = Am_BUTTON_CLICK;
      char_list.Set(parent_char);
    }
    return Am_Value(char_list);
  } else
    return Am_Input_Char("LEFT_CLICK");
}